

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_7::Validator::CheckTypeIndex
          (Validator *this,Location *loc,Type actual,Type expected,char *desc,Index index,
          char *index_kind)

{
  char *pcVar1;
  char *pcVar2;
  
  if (((actual != Any) && (expected != actual)) && (expected != Any)) {
    pcVar1 = GetTypeName(actual);
    pcVar2 = GetTypeName(expected);
    PrintError(this,loc,"type mismatch for %s %u of %s. got %s, expected %s",index_kind,(ulong)index
               ,desc,pcVar1,pcVar2);
  }
  return;
}

Assistant:

void Validator::CheckTypeIndex(const Location* loc,
                               Type actual,
                               Type expected,
                               const char* desc,
                               Index index,
                               const char* index_kind) {
  if (expected != actual && expected != Type::Any && actual != Type::Any) {
    PrintError(
        loc, "type mismatch for %s %" PRIindex " of %s. got %s, expected %s",
        index_kind, index, desc, GetTypeName(actual), GetTypeName(expected));
  }
}